

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_main.cc
# Opt level: O1

void __thiscall MyNN::MyNN(MyNN *this)

{
  int iVar1;
  long lVar2;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<unsigned_long> __l_06;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  TensorShape w_shape4;
  TensorShape w_shape3;
  TensorShape b_shape4;
  TensorShape b_shape3;
  TensorShape b_shape2;
  TensorShape w_shape2;
  TensorShape b_shape1;
  TensorShape w_shape1;
  allocator_type local_301;
  unsigned_long local_300;
  size_t sStack_2f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2f0;
  unsigned_long local_2d8;
  size_t sStack_2d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2c8;
  unsigned_long local_2b0 [2];
  unsigned_long local_2a0;
  size_t sStack_298;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_290;
  unsigned_long local_278;
  size_t sStack_270;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_268;
  unsigned_long local_250;
  size_t sStack_248;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_240;
  unsigned_long local_228;
  size_t sStack_220;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_218;
  unsigned_long local_200;
  size_t sStack_1f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1f0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yyml::nn::LayerInterface_*>_>_>
  *local_1d8;
  size_t local_1d0;
  size_t sStack_1c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1c0;
  TensorShape local_1a8;
  TensorShape local_178;
  TensorShape local_148;
  TensorShape local_118;
  TensorShape local_e8;
  TensorShape local_b8;
  TensorShape local_88;
  TensorShape local_58;
  
  local_1d8 = &(this->super_NN).layers_;
  (this->super_NN).layers_._M_h._M_buckets = &(this->super_NN).layers_._M_h._M_single_bucket;
  (this->super_NN).layers_._M_h._M_bucket_count = 1;
  (this->super_NN).layers_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_NN).layers_._M_h._M_element_count = 0;
  (this->super_NN).layers_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_NN).layers_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_NN).layers_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_NN)._vptr_NN = (_func_int **)&PTR_Forward_0010ebc0;
  local_200 = 2;
  sStack_1f8 = 0x10;
  local_1d0 = 2;
  iVar1 = 1;
  lVar2 = 0;
  do {
    iVar1 = iVar1 * *(int *)((long)&local_200 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  sStack_1c8 = (size_t)iVar1;
  __l._M_len = 2;
  __l._M_array = &local_200;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_1c0,__l,(allocator_type *)&local_228);
  local_228 = 1;
  sStack_220 = 0x10;
  local_200 = 2;
  iVar1 = 1;
  lVar2 = 0;
  do {
    iVar1 = iVar1 * *(int *)((long)&local_228 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  sStack_1f8 = (size_t)iVar1;
  __l_00._M_len = 2;
  __l_00._M_array = &local_228;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_1f0,__l_00,(allocator_type *)&local_250);
  local_250 = 0x10;
  sStack_248 = 0x20;
  local_228 = 2;
  iVar1 = 1;
  lVar2 = 0;
  do {
    iVar1 = iVar1 * *(int *)((long)&local_250 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  sStack_220 = (size_t)iVar1;
  __l_01._M_len = 2;
  __l_01._M_array = &local_250;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_218,__l_01,(allocator_type *)&local_2d8);
  local_2d8 = 1;
  sStack_2d0 = 0x20;
  local_250 = 2;
  iVar1 = 1;
  lVar2 = 0;
  do {
    iVar1 = iVar1 * *(int *)((long)&local_2d8 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  sStack_248 = (size_t)iVar1;
  __l_02._M_len = 2;
  __l_02._M_array = &local_2d8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_240,__l_02,(allocator_type *)&local_278);
  local_278 = 0x20;
  sStack_270 = 0x10;
  local_2d8 = 2;
  iVar1 = 1;
  lVar2 = 0;
  do {
    iVar1 = iVar1 * *(int *)((long)&local_278 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  sStack_2d0 = (size_t)iVar1;
  __l_03._M_len = 2;
  __l_03._M_array = &local_278;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_2c8,__l_03,(allocator_type *)&local_300);
  local_300 = 1;
  sStack_2f8 = 0x10;
  local_278 = 2;
  iVar1 = 1;
  lVar2 = 0;
  do {
    iVar1 = iVar1 * *(int *)((long)&local_300 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  sStack_270 = (size_t)iVar1;
  __l_04._M_len = 2;
  __l_04._M_array = &local_300;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_268,__l_04,(allocator_type *)&local_2a0);
  local_2a0 = 0x10;
  sStack_298 = 1;
  local_300 = 2;
  iVar1 = 1;
  lVar2 = 0;
  do {
    iVar1 = iVar1 * *(int *)((long)&local_2a0 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  sStack_2f8 = (size_t)iVar1;
  __l_05._M_len = 2;
  __l_05._M_array = &local_2a0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_2f0,__l_05,(allocator_type *)local_2b0);
  local_2b0[0] = 1;
  local_2b0[1] = 1;
  local_2a0 = 2;
  iVar1 = 1;
  lVar2 = 0;
  do {
    iVar1 = iVar1 * *(int *)((long)local_2b0 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x10);
  sStack_298 = (size_t)iVar1;
  __l_06._M_len = 2;
  __l_06._M_array = local_2b0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_290,__l_06,&local_301);
  local_58.dim = local_1d0;
  local_58.total = sStack_1c8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_58.dims,&local_1c0);
  local_88.dim = local_200;
  local_88.total = sStack_1f8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_88.dims,&local_1f0);
  name._M_str = "dense1";
  name._M_len = 6;
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,name,&local_58,&local_88);
  if (local_88.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_b8.dim = local_228;
  local_b8.total = sStack_220;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_b8.dims,&local_218);
  local_e8.dim = local_250;
  local_e8.total = sStack_248;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_e8.dims,&local_240);
  name_00._M_str = "dense2";
  name_00._M_len = 6;
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,name_00,&local_b8,&local_e8);
  if (local_e8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_118.dim = local_2d8;
  local_118.total = sStack_2d0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_118.dims,&local_2c8);
  local_148.dim = local_278;
  local_148.total = sStack_270;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_148.dims,&local_268);
  name_01._M_str = "dense3";
  name_01._M_len = 6;
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,name_01,&local_118,&local_148);
  if (local_148.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_118.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_178.dim = local_300;
  local_178.total = sStack_2f8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_178.dims,&local_2f0);
  local_1a8.dim = local_2a0;
  local_1a8.total = sStack_298;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1a8.dims,&local_290);
  name_02._M_str = "dense4";
  name_02._M_len = 6;
  yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
            (&this->super_NN,name_02,&local_178,&local_1a8);
  if (local_1a8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_178.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.dims.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_290.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_290.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_290.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_290.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_240.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_218.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

MyNN() {
    TensorShape w_shape1{2, 16}, b_shape1{1, 16};
    TensorShape w_shape2{16, 32}, b_shape2{1, 32};
    TensorShape w_shape3{32, 16}, b_shape3{1, 16};
    TensorShape w_shape4{16, 1}, b_shape4{1, 1};
    SetLayer<DenseLayer>("dense1", w_shape1, b_shape1);
    SetLayer<DenseLayer>("dense2", w_shape2, b_shape2);
    SetLayer<DenseLayer>("dense3", w_shape3, b_shape3);
    SetLayer<DenseLayer>("dense4", w_shape4, b_shape4);
  }